

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O0

void print_shifts(action *p)

{
  action *local_20;
  action *q;
  action *paStack_10;
  int count;
  action *p_local;
  
  q._4_4_ = 0;
  for (local_20 = p; local_20 != (action *)0x0; local_20 = local_20->next) {
    if ((local_20->suppressed < '\x02') && (local_20->action_code == '\x01')) {
      q._4_4_ = q._4_4_ + 1;
    }
  }
  paStack_10 = p;
  if (0 < q._4_4_) {
    for (; paStack_10 != (action *)0x0; paStack_10 = paStack_10->next) {
      if ((paStack_10->action_code == '\x01') && (paStack_10->suppressed == '\0')) {
        fprintf((FILE *)verbose_file,"\t%s  shift %d\n",symbol_name[paStack_10->symbol],
                (ulong)(uint)paStack_10->number);
      }
    }
  }
  return;
}

Assistant:

void print_shifts(action *p)
{
    register int count;
    register action *q;

    count = 0;
    for (q = p; q; q = q->next)
    {
	if (q->suppressed < 2 && q->action_code == SHIFT)
	    ++count;
    }

    if (count > 0)
    {
	for (; p; p = p->next)
	{
	    if (p->action_code == SHIFT && p->suppressed == 0)
		fprintf(verbose_file, "\t%s  shift %d\n",
			    symbol_name[p->symbol], p->number);
	}
    }
}